

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O3

ValueType __thiscall ValueType::FromObjectWithArray(ValueType *this,DynamicObject *object)

{
  code *pcVar1;
  bool bVar2;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar3;
  ValueType valueType_00;
  undefined4 *puVar4;
  JavascriptArray *objectArray;
  TypeId typeId;
  ValueType *unaff_RBX;
  ObjectType objectType;
  ArrayObject *obj;
  anon_union_2_4_ea848c7b_for_ValueType_13 aStack_56;
  anon_union_2_4_ea848c7b_for_ValueType_13 aStack_54;
  anon_union_2_4_ea848c7b_for_ValueType_13 aStack_52;
  ValueType *pVStack_50;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a [4];
  ValueType valueType;
  
  if (this == (ValueType *)0x0) {
    FromObjectWithArray();
    obj = (ArrayObject *)this;
  }
  else {
    if (*(long *)this != VirtualTableInfo<Js::DynamicObject>::Address) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      object = (DynamicObject *)0x565;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x565,"(VirtualTableInfo<DynamicObject>::HasVirtualTable(object))",
                         "VirtualTableInfo<DynamicObject>::HasVirtualTable(object)");
      if (!bVar2) goto LAB_00b13a7f;
      *puVar4 = 0;
    }
    if (**(int **)(this + 4) != 0x1c) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      object = (DynamicObject *)0x566;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x566,"(object->GetTypeId() == TypeIds_Object)",
                         "object->GetTypeId() == TypeIds_Object");
      if (!bVar2) goto LAB_00b13a7f;
      *puVar4 = 0;
    }
    bVar2 = Js::DynamicObject::HasObjectArray((DynamicObject *)this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      object = (DynamicObject *)0x567;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x567,"(object->HasObjectArray())","object->HasObjectArray()");
      if (!bVar2) {
LAB_00b13a7f:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    obj = (ArrayObject *)this;
    bVar2 = Js::DynamicObject::HasObjectArray((DynamicObject *)this);
    unaff_RBX = this;
    if ((bVar2) && (obj = *(ArrayObject **)(this + 0xc), obj != (ArrayObject *)0x0)) {
      if ((obj->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
          super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject ==
          (_func_int **)VirtualTableInfo<Js::JavascriptArray>::Address) {
        objectArray = Js::VarTo<Js::JavascriptArray,Js::ArrayObject>(obj);
        aVar3.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             FromObjectArray(objectArray);
        return (anon_union_2_4_ea848c7b_for_ValueType_13)
               (anon_union_2_4_ea848c7b_for_ValueType_13)aVar3.field_0;
      }
      local_1a[0].bits = Object;
      SetObjectType((ValueType *)&local_1a[0].field_0,Object);
      aVar3.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           Verify(local_1a[0].field_0);
      return (anon_union_2_4_ea848c7b_for_ValueType_13)
             (anon_union_2_4_ea848c7b_for_ValueType_13)aVar3.field_0;
    }
  }
  objectType = (ObjectType)obj;
  FromObjectWithArray();
  pVStack_50 = unaff_RBX;
  if ((JavascriptArray *)object == (JavascriptArray *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x57d,"(array)","array");
    if (!bVar2) goto LAB_00b13c19;
    *puVar4 = 0;
  }
  if (((((JavascriptArray *)object)->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
       type.ptr)->typeId != typeId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x57e,"(array->GetTypeId() == arrayTypeId)",
                       "array->GetTypeId() == arrayTypeId");
    if (!bVar2) goto LAB_00b13c19;
    *puVar4 = 0;
  }
  if (1 < (ushort)(objectType - ObjectWithArray)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x51,
                       "(objectType == ObjectType::Array || objectType == ObjectType::ObjectWithArray)"
                       ,
                       "objectType == ObjectType::Array || objectType == ObjectType::ObjectWithArray"
                      );
    if (!bVar2) {
LAB_00b13c19:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  aStack_56.bits = Object;
  SetObjectType((ValueType *)&aStack_56.field_0,objectType);
  aVar3 = aStack_56;
  Verify((ValueType)aStack_56.field_0);
  aStack_52.field_0 = aVar3.field_0;
  bVar2 = Js::JavascriptArray::HasNoMissingValues_Unchecked((JavascriptArray *)object);
  aStack_54.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       SetHasNoMissingValues((ValueType *)&aStack_52.field_0,bVar2);
  valueType_00 = SetArrayTypeId((ValueType *)&aStack_54.field_0,typeId);
  aVar3.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)Verify(valueType_00)
  ;
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)aVar3.field_0;
}

Assistant:

ValueType ValueType::FromObjectWithArray(Js::DynamicObject *const object)
{
    using namespace Js;
    Assert(object);
    Assert(VirtualTableInfo<DynamicObject>::HasVirtualTable(object));
    Assert(object->GetTypeId() == TypeIds_Object); // this check should be a superset of the DynamicObject vtable check above
    Assert(object->HasObjectArray());

    ArrayObject *const objectArray = object->GetObjectArray();
    Assert(objectArray);
    if(!VirtualTableInfo<JavascriptArray>::HasVirtualTable(objectArray))
        return GetObject(ObjectType::Object);
    return FromObjectArray(VarTo<JavascriptArray>(objectArray));
}